

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer_device_debug.cpp
# Opt level: O0

Vec3fa embree::renderPixelAOShader
                 (DebugShaderData *data,float x,float y,ISPCCamera *camera,RayStats *stats,
                 RTCFeatureFlags feature_mask)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  int *in_RCX;
  float *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  float in_XMM0_Da;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  float in_XMM1_Da;
  float fVar8;
  Vec3fa VVar9;
  RTCOccludedArguments args_1;
  Ray shadow;
  Sample3f dir;
  Vec2f sample;
  int i;
  RandomSampler sampler;
  Vec3fa hitPos;
  float intensity;
  Vec3fa col;
  Vec3fa Nf;
  Vec3fa Ng;
  RTCIntersectArguments args;
  Ray ray;
  float v;
  float u;
  vfloat4 c_4;
  vfloat4 b_1;
  vfloat4 a_4;
  __m128 c_3;
  __m128 r_2;
  __m128 a_3;
  __m128 c;
  __m128 r;
  __m128 a;
  __m128 c_1;
  __m128 r_1;
  __m128 a_1;
  vfloat4 c_2;
  vfloat4 b;
  vfloat4 a_2;
  uint hash;
  uint n_1;
  uint m_1;
  uint r2_1;
  uint r1_1;
  uint c2_1;
  uint c1_1;
  uint n;
  uint m;
  uint r2;
  uint r1;
  uint c2;
  uint c1;
  uint n_2;
  uint m_2;
  uint n_3;
  uint m_3;
  float local_14fc;
  undefined4 local_14d8;
  undefined4 local_14d4;
  undefined8 local_14d0;
  undefined8 local_14c8;
  undefined8 local_14c0;
  undefined8 local_14b8;
  undefined8 uStackY_14b0;
  undefined8 local_14a8;
  Vec3fa *pVStackY_14a0;
  undefined8 local_1498;
  Vec3fa *in_stack_ffffffffffffeb70;
  undefined4 uVar10;
  float in_stack_ffffffffffffeb78;
  float in_stack_ffffffffffffeb7c;
  undefined1 auStack_1468 [20];
  undefined4 local_1454;
  undefined4 local_1450;
  undefined8 local_1438;
  undefined8 uStack_1430;
  float local_1418;
  float local_1414;
  int local_1410;
  uint local_140c;
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined8 local_13f8;
  Vec3fa *pVStack_13f0;
  undefined8 local_13e8;
  Vec3fa *pVStack_13e0;
  float local_13cc;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  float local_13a8;
  float fStack_13a4;
  float fStack_13a0;
  float fStack_139c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1398;
  embree local_1388 [20];
  float local_1374 [3];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1368;
  undefined4 local_1358;
  undefined4 local_1354;
  undefined8 local_1350;
  undefined8 local_1348;
  undefined8 local_1340;
  float local_1334 [3];
  float local_1328 [3];
  float local_131c [3];
  float local_1310 [3];
  float local_1304 [3];
  float local_12f8 [2];
  ulong uStack_12f0;
  undefined8 local_12e8;
  ulong uStack_12e0;
  undefined8 local_12d8;
  ulong uStack_12d0;
  float local_12c8;
  float fStack_12c4;
  undefined8 uStack_12c0;
  float local_12b8;
  undefined4 local_12b4;
  float local_12a8;
  float local_12a4;
  float local_12a0;
  undefined4 local_1294;
  int local_1290;
  undefined4 local_126c;
  int *local_1268;
  float local_1258;
  float local_1254;
  long local_1250;
  undefined8 *local_1240;
  undefined8 *local_1238;
  float *local_1230;
  undefined8 *local_1228;
  float *local_1220;
  float *local_1218;
  undefined8 *local_1210;
  undefined1 *local_1208;
  undefined8 *local_1200;
  undefined8 *local_11f8;
  float *local_11f0;
  float *local_11e8;
  undefined8 *local_11e0;
  undefined8 *local_11d8;
  float local_11cc;
  float *local_11c8;
  float *local_11c0;
  float local_11b4;
  float *local_11b0;
  float *local_11a8;
  float local_119c;
  float local_1198;
  float local_1194;
  float *local_1190;
  float *local_1188;
  float *local_1180;
  float local_1174;
  float local_1170;
  float local_116c;
  float *local_1168;
  float *local_1160;
  float *local_1158;
  float local_114c;
  float local_1148;
  float local_1144;
  float *local_1140;
  float *local_1138;
  float *local_1130;
  float local_1124;
  float local_1120;
  float local_111c [3];
  float *local_1110;
  float *local_1108;
  undefined8 *local_1100;
  undefined8 *local_10f8;
  undefined1 *local_10f0;
  undefined1 *local_10e8;
  undefined8 *local_10e0;
  undefined8 *local_10d8;
  undefined4 *local_10d0;
  undefined8 *local_10c8;
  undefined4 *local_10c0;
  undefined8 *local_10b8;
  int *local_10b0;
  float local_1094;
  float *local_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined8 *local_1078;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_1070;
  undefined8 *local_1068;
  undefined8 *local_1060;
  undefined8 *local_1058;
  undefined8 *local_1050;
  float *local_1048;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_1040;
  float *local_1038;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_1030;
  float local_1024;
  undefined8 *local_1020;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_1018;
  undefined8 *local_1010;
  float local_1008;
  undefined4 local_1004;
  float *local_1000;
  undefined8 *local_ff8;
  undefined8 *local_ff0;
  undefined8 *local_fe8;
  undefined8 *local_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  float *local_fc0;
  float local_fb4;
  undefined8 *local_fb0;
  undefined4 local_fa4;
  int local_fa0;
  uint local_f9c;
  uint *local_f98;
  float local_f90;
  float local_f8c;
  uint *local_f88;
  float *local_f80;
  float *local_f78;
  float *local_f70;
  float *local_f68;
  undefined8 *local_f60;
  undefined8 *local_f58;
  undefined8 *local_f50;
  undefined8 *local_f48;
  float local_ee8;
  ulong uStack_ee0;
  float local_ed8;
  undefined4 local_ecc;
  float local_ec8;
  ulong uStack_ec0;
  float local_eb8;
  undefined4 local_eac;
  undefined8 local_ea8;
  ulong uStack_ea0;
  float local_e98;
  float local_e94;
  float local_e90;
  undefined4 local_e8c;
  undefined1 *local_e88;
  undefined8 *local_e80;
  float *local_e78;
  undefined8 *local_e70;
  undefined1 *local_e68;
  float *local_e60;
  float local_e38;
  float fStack_e34;
  float fStack_e30;
  float fStack_e2c;
  float local_e1c;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 *local_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 *local_d80;
  undefined8 *local_d78;
  undefined8 *local_d70;
  undefined8 *local_d68;
  undefined8 *local_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 *local_d40;
  undefined8 *local_d38;
  undefined8 *local_d30;
  float local_d28;
  float fStack_d24;
  float fStack_d20;
  float fStack_d1c;
  undefined8 *local_d18;
  undefined8 *local_d10;
  undefined8 *local_d08;
  undefined8 *local_d00;
  float local_cf8;
  float fStack_cf4;
  float fStack_cf0;
  float fStack_cec;
  undefined8 *local_ce8;
  undefined8 *local_ce0;
  undefined8 *local_cd8;
  undefined8 *local_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 *local_cb0;
  float local_ca8;
  float fStack_ca4;
  float fStack_ca0;
  float fStack_c9c;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 *local_c80;
  undefined8 *local_c78;
  undefined8 *local_c70;
  undefined8 *local_c68;
  undefined8 *local_c60;
  undefined8 *local_c58;
  undefined8 *local_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 *local_c30;
  float local_c28;
  float fStack_c24;
  float fStack_c20;
  float fStack_c1c;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 *local_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  float local_b78;
  float fStack_b74;
  float fStack_b70;
  float fStack_b6c;
  undefined8 *local_b60;
  float local_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 *local_b20;
  undefined8 local_b18;
  Vec3fa *pVStack_b10;
  undefined8 *local_b00;
  ulong local_af8;
  undefined8 uStack_af0;
  undefined1 local_ae8 [16];
  ulong local_ad8;
  undefined8 uStack_ad0;
  float local_abc;
  ulong local_ab8;
  undefined8 uStack_ab0;
  ulong local_aa8;
  undefined8 uStack_aa0;
  undefined1 local_a98 [16];
  ulong local_a88;
  undefined8 uStack_a80;
  float local_a6c;
  ulong local_a68;
  undefined8 uStack_a60;
  ulong local_a58;
  undefined8 uStack_a50;
  undefined1 local_a48 [16];
  ulong local_a38;
  undefined8 uStack_a30;
  float local_a1c;
  ulong local_a18;
  undefined8 uStack_a10;
  undefined1 local_a08 [16];
  undefined4 local_9ec;
  undefined1 local_9e8 [16];
  undefined4 local_9cc;
  undefined1 local_9c8 [16];
  float local_9ac;
  undefined1 local_9a8 [16];
  undefined4 local_98c;
  undefined1 local_988 [16];
  undefined4 local_96c;
  undefined1 local_968 [16];
  float local_94c;
  undefined1 local_948 [16];
  undefined4 local_92c;
  undefined1 local_928 [16];
  undefined4 local_90c;
  undefined1 local_908 [16];
  float local_8ec;
  ulong local_8e8;
  undefined8 uStack_8e0;
  ulong local_8d8;
  undefined8 uStack_8d0;
  ulong local_8c8;
  undefined8 uStack_8c0;
  ulong local_8b8;
  undefined8 uStack_8b0;
  ulong local_8a8;
  undefined8 uStack_8a0;
  ulong local_898;
  undefined8 uStack_890;
  ulong local_888;
  undefined8 uStack_880;
  ulong local_878;
  undefined8 uStack_870;
  ulong local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  ulong local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  ulong local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  ulong local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  ulong local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  ulong local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  ulong local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  ulong local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  ulong local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  ulong local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  ulong local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  ulong local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  ulong local_688;
  undefined8 uStack_680;
  undefined8 local_658;
  undefined8 uStack_650;
  float local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  float local_61c;
  float *local_618;
  undefined8 *local_610;
  undefined8 local_608;
  undefined8 uStack_600;
  float *local_5f0;
  float *local_5e8;
  float *local_5e0;
  float *local_5d8;
  undefined8 *local_5d0;
  float local_5c8;
  float fStack_5c4;
  float fStack_5c0;
  float fStack_5bc;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  undefined8 *local_5a0;
  float *local_598;
  undefined8 *local_590;
  undefined8 local_588;
  undefined8 uStack_580;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float *local_560;
  undefined8 *local_558;
  undefined8 *local_550;
  ulong uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  float local_524;
  undefined8 *local_520;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float local_508;
  float local_504;
  undefined8 *local_500;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4e8;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  undefined8 *local_4c0;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined8 *local_4a0;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  undefined8 *local_480;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  undefined8 *local_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 *local_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 *local_3e0;
  undefined8 *local_3d8;
  undefined8 *local_3d0;
  undefined8 *local_3c8;
  undefined8 *local_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 *local_3a0;
  undefined8 *local_398;
  undefined8 *local_390;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined8 *local_378;
  undefined8 *local_370;
  undefined8 *local_368;
  undefined8 *local_360;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined8 *local_348;
  undefined8 *local_340;
  undefined8 *local_338;
  undefined8 *local_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 *local_310;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 *local_2e0;
  undefined8 *local_2d8;
  undefined8 *local_2d0;
  undefined8 *local_2c8;
  undefined8 *local_2c0;
  undefined8 *local_2b8;
  undefined8 *local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 *local_290;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 *local_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  uint local_214;
  undefined4 local_210;
  uint local_20c;
  uint *local_208;
  undefined4 local_1fc;
  undefined4 local_1f8;
  undefined4 local_1f4;
  undefined4 local_1f0;
  undefined4 local_1ec;
  undefined4 local_1e8;
  undefined4 local_1e4;
  uint local_1e0;
  undefined4 local_1dc;
  undefined4 local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  undefined4 local_1cc;
  undefined4 local_1c8;
  uint local_1c4;
  uint local_1c0;
  uint local_1bc;
  uint *local_1b8;
  uint *local_1b0;
  uint *local_1a8;
  uint *local_1a0;
  uint *local_198;
  uint *local_190;
  undefined4 local_188;
  undefined4 local_184;
  uint local_180;
  undefined4 local_17c;
  undefined4 local_178;
  uint local_174;
  float *local_170;
  float *local_168;
  float *local_160;
  float *local_158;
  float *local_150;
  float *local_148;
  float *local_140;
  float *local_138;
  float *local_130;
  float *local_128;
  float *local_120;
  float *local_118;
  float *local_110;
  float *local_108;
  float *local_100;
  float *local_f8;
  float local_ec;
  float local_e8;
  float local_e4;
  float *local_e0;
  float *local_d8;
  float *local_d0;
  float *local_c8;
  float *local_c0;
  float *local_b8;
  float *local_b0;
  float local_a4;
  float local_a0;
  float local_9c;
  float *local_98;
  float *local_90;
  float *local_88;
  float *local_80;
  float *local_78;
  float *local_70;
  float *local_68;
  float *local_60;
  float *local_58;
  float *local_50;
  float *local_48;
  float *local_40;
  float *local_38;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_18;
  float local_c;
  
  local_1240 = &local_12d8;
  local_e78 = &local_12c8;
  local_e60 = &local_12a8;
  local_1230 = in_RDX + 9;
  local_1228 = &local_12e8;
  local_e90 = in_RDX[0xb];
  local_e98 = *local_1230;
  local_e94 = in_RDX[10];
  local_ea8 = *(undefined8 *)local_1230;
  local_e8c = 0;
  uStack_ea0 = (ulong)(uint)local_e90;
  local_1160 = local_1328;
  local_1110 = &local_1254;
  local_111c[0] = in_XMM0_Da * *in_RDX;
  local_160 = local_111c;
  local_168 = &local_1120;
  local_170 = &local_1124;
  local_1140 = in_RDX + 3;
  local_1168 = local_1334;
  local_1138 = &local_1258;
  local_1144 = in_XMM1_Da * *local_1140;
  local_140 = &local_1144;
  local_148 = &local_1148;
  local_150 = &local_114c;
  local_1188 = local_131c;
  local_116c = local_111c[0] + local_1144;
  local_120 = &local_116c;
  local_128 = &local_1170;
  local_130 = &local_1174;
  local_1190 = in_RDX + 6;
  local_11b0 = local_1310;
  local_1194 = local_116c + *local_1190;
  local_100 = &local_1194;
  local_108 = &local_1198;
  local_110 = &local_119c;
  local_1220 = local_1304;
  local_24 = local_119c * local_119c;
  local_30 = local_1198 * local_1198 + local_24;
  local_a6c = local_1194 * local_1194 + local_30;
  local_968._4_4_ = 0;
  local_968._0_4_ = local_a6c;
  local_a88 = local_968._0_8_;
  uStack_a80 = 0;
  local_8d8 = local_968._0_8_;
  uStack_8d0 = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_968._0_8_;
  local_a98 = rsqrtss(auVar2,auVar2);
  local_96c = 0x3fc00000;
  local_988 = ZEXT416(0x3fc00000);
  local_738 = local_a98._0_8_;
  uVar7 = local_738;
  uStack_730 = local_a98._8_8_;
  local_738._0_4_ = local_a98._0_4_;
  local_728 = (ulong)(uint)((float)local_738 * 1.5);
  uStack_720 = 0;
  local_98c = 0xbf000000;
  local_9a8 = ZEXT416(0xbf000000);
  local_758 = local_9a8._0_8_;
  uStack_750 = 0;
  local_748 = (ulong)(uint)(local_a6c * -0.5);
  uStack_740 = 0;
  local_778 = local_a98._0_8_;
  uStack_770 = local_a98._8_8_;
  local_11b4 = local_a6c * -0.5 * (float)local_738;
  local_768 = (ulong)(uint)local_11b4;
  uStack_760 = 0;
  local_798 = local_a98._0_8_;
  uStack_790 = local_a98._8_8_;
  local_788 = CONCAT44(local_a98._4_4_,(float)local_738 * (float)local_738);
  uStack_780 = local_a98._8_8_;
  local_7b8 = local_788;
  uStack_7b0 = local_a98._8_8_;
  local_11b4 = local_11b4 * (float)local_738 * (float)local_738;
  local_7a8 = (ulong)(uint)local_11b4;
  uStack_7a0 = 0;
  local_898 = local_7a8;
  uStack_890 = 0;
  local_11b4 = (float)local_738 * 1.5 + local_11b4;
  local_888 = (ulong)(uint)local_11b4;
  uStack_880 = 0;
  local_aa8 = local_888;
  uStack_aa0 = 0;
  local_a68 = local_888;
  uStack_a60 = 0;
  local_e0 = &local_11b4;
  local_eb8 = local_1194 * local_11b4;
  local_e8 = local_1198 * local_11b4;
  fVar5 = local_119c * local_11b4;
  local_b8 = &local_e4;
  local_c0 = &local_e8;
  local_c8 = &local_ec;
  local_1218 = local_12f8;
  local_eac = 0;
  fVar6 = 0.0;
  uStack_ec0 = (ulong)(uint)local_ec;
  local_11e8 = &local_12c8;
  local_11f0 = local_12f8;
  local_10f8 = &local_12d8;
  uStack_12d0 = (ulong)(uint)local_e90;
  local_10e8 = &inf;
  fVar8 = local_ec;
  local_126c = in_R8D;
  local_1268 = in_RCX;
  local_1258 = in_XMM1_Da;
  local_1254 = in_XMM0_Da;
  local_1250 = in_RSI;
  local_11e0 = local_1228;
  local_11d8 = local_1240;
  local_11a8 = local_1220;
  local_119c = local_1174 + in_RDX[8];
  local_1198 = local_1170 + in_RDX[7];
  local_1180 = local_11b0;
  local_1174 = local_1124 + local_114c;
  local_1170 = local_1120 + local_1148;
  local_1158 = local_1188;
  local_114c = in_XMM1_Da * in_RDX[5];
  local_1148 = in_XMM1_Da * in_RDX[4];
  local_1130 = local_1168;
  local_1124 = in_XMM0_Da * in_RDX[2];
  local_1120 = in_XMM0_Da * in_RDX[1];
  local_1108 = local_1160;
  local_e70 = local_1240;
  local_968 = ZEXT416((uint)local_a6c);
  local_94c = local_a6c;
  local_738 = uVar7;
  local_158 = local_1160;
  local_138 = local_1168;
  local_118 = local_1188;
  local_f8 = local_11b0;
  local_ec = fVar5;
  local_e4 = local_eb8;
  local_d8 = local_11b0;
  local_d0 = local_1220;
  local_b0 = local_1220;
  local_60 = local_11b0;
  local_40 = local_11b0;
  local_38 = local_11b0;
  local_2c = local_1194;
  local_28 = local_1194;
  local_1334[0] = local_1144;
  local_1328[0] = local_111c[0];
  local_131c[0] = local_116c;
  local_1310[0] = local_1194;
  local_1304[0] = local_eb8;
  uStack_12f0 = uStack_ec0;
  local_12e8 = local_ea8;
  uStack_12e0 = uStack_ea0;
  local_12d8 = local_ea8;
  uStack_12c0 = uStack_ec0;
  local_ec8 = local_eb8;
  local_12f8[0] = local_eb8;
  local_12b8 = std::numeric_limits<float>::infinity();
  local_1290 = -1;
  local_1294 = 0xffffffff;
  local_12b4 = 0xffffffff;
  local_10d8 = &local_12d8;
  local_10c0 = &local_1358;
  local_1358 = 0;
  local_1350 = 0;
  local_1348 = 0;
  local_1340 = 0;
  local_1354 = local_126c;
  local_10b8 = &local_12d8;
  rtcTraversableIntersect1(*(undefined8 *)(local_1250 + 8),local_10b8,&local_1358);
  local_10b0 = local_1268;
  *local_1268 = *local_1268 + 1;
  if (local_1290 == -1) {
    uVar7 = 0;
    *in_RDI = 0;
    in_RDI[1] = 0;
    local_13a8 = fVar8;
    fStack_13a4 = fVar6;
  }
  else {
    local_11c8 = &local_12a8;
    local_11c0 = local_1374;
    local_c = local_12a0 * local_12a0;
    local_18 = local_12a4 * local_12a4 + local_c;
    local_a1c = local_12a8 * local_12a8 + local_18;
    local_9c8._4_4_ = 0;
    local_9c8._0_4_ = local_a1c;
    local_a38 = local_9c8._0_8_;
    uStack_a30 = 0;
    local_8e8 = local_9c8._0_8_;
    uStack_8e0 = 0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_9c8._0_8_;
    local_a48 = rsqrtss(auVar1,auVar1);
    local_9cc = 0x3fc00000;
    local_9e8 = ZEXT416(0x3fc00000);
    local_7d8 = local_a48._0_8_;
    uVar7 = local_7d8;
    uStack_7d0 = local_a48._8_8_;
    local_7d8._0_4_ = local_a48._0_4_;
    local_7c8 = (ulong)(uint)((float)local_7d8 * 1.5);
    uStack_7c0 = 0;
    local_9ec = 0xbf000000;
    local_a08 = ZEXT416(0xbf000000);
    local_7f8 = local_a08._0_8_;
    uStack_7f0 = 0;
    local_7e8 = (ulong)(uint)(local_a1c * -0.5);
    uStack_7e0 = 0;
    local_818 = local_a48._0_8_;
    uStack_810 = local_a48._8_8_;
    local_11cc = local_a1c * -0.5 * (float)local_7d8;
    local_808 = (ulong)(uint)local_11cc;
    uStack_800 = 0;
    local_838 = local_a48._0_8_;
    uStack_830 = local_a48._8_8_;
    local_828 = CONCAT44(local_a48._4_4_,(float)local_7d8 * (float)local_7d8);
    uStack_820 = local_a48._8_8_;
    local_858 = local_828;
    uStack_850 = local_a48._8_8_;
    local_11cc = local_11cc * (float)local_7d8 * (float)local_7d8;
    local_848 = (ulong)(uint)local_11cc;
    uStack_840 = 0;
    local_8b8 = local_848;
    uStack_8b0 = 0;
    local_11cc = (float)local_7d8 * 1.5 + local_11cc;
    local_8a8 = (ulong)(uint)local_11cc;
    uStack_8a0 = 0;
    local_a58 = local_8a8;
    uStack_a50 = 0;
    local_a18 = local_8a8;
    uStack_a10 = 0;
    local_98 = &local_11cc;
    local_ed8 = local_12a8 * local_11cc;
    local_70 = &local_9c;
    local_78 = &local_a0;
    local_80 = &local_a4;
    local_1368.m128[1] = local_a0;
    local_ecc = 0;
    uStack_ee0 = (ulong)(uint)local_a4;
    local_1040 = &local_1398;
    local_b58 = local_12c8;
    fStack_b54 = fStack_12c4;
    fStack_b50 = (float)uStack_12c0;
    fStack_b4c = uStack_12c0._4_4_;
    local_1398.m128[0] = local_12c8;
    local_1398.m128[1] = fStack_12c4;
    local_1398.m128[2] = (float)uStack_12c0;
    local_1398.m128[3] = uStack_12c0._4_4_;
    local_1048 = &local_12c8;
    local_1038 = local_11c0;
    local_1030 = &local_1368;
    local_b40 = local_1040;
    local_9c8 = ZEXT416((uint)local_a1c);
    local_9ac = local_a1c;
    local_7d8 = uVar7;
    local_a4 = local_12a0 * local_11cc;
    local_a0 = local_12a4 * local_11cc;
    local_9c = local_ed8;
    local_90 = local_11c8;
    local_88 = local_11c0;
    local_68 = local_11c0;
    local_58 = local_11c8;
    local_50 = local_11c8;
    local_48 = local_11c8;
    local_1374[0] = local_ed8;
    local_1368._8_8_ = uStack_ee0;
    local_1368.m128[0] = local_ed8;
    local_ee8 = local_ed8;
    faceforward(local_1388,(Vec3fa *)&local_1368.field_1,(Vec3fa *)&local_1040->field_1,
                (Vec3fa *)&local_1368);
    local_1058 = &local_13c8;
    local_5d0 = &local_608;
    local_5b8 = local_12c8;
    fStack_5b4 = fStack_12c4;
    fStack_5b0 = (float)uStack_12c0;
    fStack_5ac = uStack_12c0._4_4_;
    local_5c8 = local_12c8;
    fStack_5c4 = fStack_12c4;
    fStack_5c0 = (float)uStack_12c0;
    fStack_5bc = uStack_12c0._4_4_;
    local_498 = local_12c8 * local_12c8;
    fStack_494 = fStack_12c4 * fStack_12c4;
    fStack_490 = (float)uStack_12c0 * (float)uStack_12c0;
    fStack_48c = uStack_12c0._4_4_ * uStack_12c0._4_4_;
    local_3f8 = CONCAT44(fStack_494,local_498);
    uStack_3f0 = CONCAT44(fStack_48c,fStack_490);
    local_3e0 = &local_418;
    local_3d0 = &local_428;
    local_328 = CONCAT44(fStack_494,fStack_494);
    uStack_320 = CONCAT44(fStack_494,fStack_494);
    local_3c0 = &local_438;
    local_2a8 = CONCAT44(fStack_490,fStack_490);
    uStack_2a0 = CONCAT44(fStack_490,fStack_490);
    local_398 = &local_458;
    local_358 = local_498 + fStack_494;
    fStack_354 = fStack_494 + fStack_494;
    fStack_350 = fStack_490 + fStack_494;
    fStack_34c = fStack_48c + fStack_494;
    local_228 = CONCAT44(fStack_354,local_358);
    uStack_220 = CONCAT44(fStack_34c,fStack_350);
    local_390 = &local_448;
    local_abc = local_358 + fStack_490;
    fStack_384 = fStack_354 + fStack_490;
    fStack_380 = fStack_350 + fStack_490;
    fStack_37c = fStack_34c + fStack_490;
    local_3b8 = CONCAT44(fStack_384,local_abc);
    uStack_3b0 = CONCAT44(fStack_37c,fStack_380);
    local_908 = ZEXT416((uint)local_abc);
    local_ad8 = CONCAT44(0,local_abc);
    uStack_ad0 = 0;
    uStack_8c0 = 0;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_ad8;
    local_ae8 = rsqrtss(auVar3,auVar3);
    local_90c = 0x3fc00000;
    local_928 = ZEXT416(0x3fc00000);
    local_698 = local_ae8._0_8_;
    uVar7 = local_698;
    uStack_690 = local_ae8._8_8_;
    local_698._0_4_ = local_ae8._0_4_;
    local_688 = (ulong)(uint)((float)local_698 * 1.5);
    uStack_680 = 0;
    local_92c = 0xbf000000;
    local_948 = ZEXT416(0xbf000000);
    local_6b8 = local_948._0_8_;
    uStack_6b0 = 0;
    local_6a8 = (ulong)(uint)(local_abc * -0.5);
    uStack_6a0 = 0;
    local_6d8 = local_ae8._0_8_;
    uStack_6d0 = local_ae8._8_8_;
    local_61c = local_abc * -0.5 * (float)local_698;
    local_6c8 = (ulong)(uint)local_61c;
    uStack_6c0 = 0;
    local_6f8 = local_ae8._0_8_;
    uStack_6f0 = local_ae8._8_8_;
    local_6e8 = CONCAT44(local_ae8._4_4_,(float)local_698 * (float)local_698);
    uStack_6e0 = local_ae8._8_8_;
    local_718 = local_6e8;
    uStack_710 = local_ae8._8_8_;
    local_61c = local_61c * (float)local_698 * (float)local_698;
    local_708 = (ulong)(uint)local_61c;
    uStack_700 = 0;
    local_878 = local_708;
    uStack_870 = 0;
    local_61c = (float)local_698 * 1.5 + local_61c;
    local_868 = (ulong)(uint)local_61c;
    uStack_860 = 0;
    local_af8 = local_868;
    uStack_af0 = 0;
    local_ab8 = local_868;
    uStack_ab0 = 0;
    local_5a0 = &local_638;
    local_588 = CONCAT44(local_61c,local_61c);
    uStack_580 = CONCAT44(local_61c,local_61c);
    local_578 = local_12c8;
    fStack_574 = fStack_12c4;
    fStack_570 = (float)uStack_12c0;
    fStack_56c = uStack_12c0._4_4_;
    local_4b8 = local_12c8 * local_61c;
    fStack_4b4 = fStack_12c4 * local_61c;
    fStack_4b0 = (float)uStack_12c0 * local_61c;
    fStack_4ac = uStack_12c0._4_4_ * local_61c;
    local_b38 = CONCAT44(fStack_4b4,local_4b8);
    uStack_b30 = CONCAT44(fStack_4ac,fStack_4b0);
    local_1078 = &local_13b8;
    local_1010 = &local_1088;
    local_648 = local_1368.m128[0];
    uStack_640._0_4_ = (float)local_1368._8_8_;
    uStack_640._4_4_ = (float)((ulong)local_1368._8_8_ >> 0x20);
    local_b78 = local_1368.m128[0] * local_4b8;
    local_ca8 = local_1368.m128[1] * fStack_4b4;
    local_c28 = (float)uStack_640 * fStack_4b0;
    fStack_b6c = uStack_640._4_4_ * fStack_4ac;
    local_d98 = CONCAT44(local_ca8,local_b78);
    uStack_d90 = CONCAT44(fStack_b6c,local_c28);
    local_d80 = &local_db8;
    local_d70 = &local_dc8;
    local_cc8 = CONCAT44(local_ca8,local_ca8);
    uStack_cc0 = CONCAT44(local_ca8,local_ca8);
    local_d60 = &local_dd8;
    local_c48 = CONCAT44(local_c28,local_c28);
    uStack_c40 = CONCAT44(local_c28,local_c28);
    local_d38 = &local_df8;
    local_cf8 = local_b78 + local_ca8;
    fStack_cf4 = local_ca8 + local_ca8;
    fStack_cf0 = local_c28 + local_ca8;
    fStack_cec = fStack_b6c + local_ca8;
    local_bc8 = CONCAT44(fStack_cf4,local_cf8);
    uStack_bc0 = CONCAT44(fStack_cec,fStack_cf0);
    local_d30 = &local_de8;
    local_1024 = local_cf8 + local_c28;
    fStack_d24 = fStack_cf4 + local_c28;
    fStack_d20 = fStack_cf0 + local_c28;
    fStack_d1c = fStack_cec + local_c28;
    local_d58 = CONCAT44(fStack_d24,local_1024);
    uStack_d50 = CONCAT44(fStack_d1c,fStack_d20);
    local_1008 = ABS(local_1024) * 0.8 + 0.3;
    local_1004 = 0x3f800000;
    local_14fc = local_1008;
    if (1.0 < local_1008) {
      local_14fc = 1.0;
    }
    local_1090 = &local_13a8;
    local_1094 = local_14fc;
    local_e1c = local_14fc;
    local_e38 = local_14fc;
    fStack_e34 = local_14fc;
    fStack_e30 = local_14fc;
    fStack_e2c = local_14fc;
    local_13a8 = local_14fc;
    fStack_13a4 = local_14fc;
    fStack_13a0 = local_14fc;
    fStack_139c = local_14fc;
    local_13cc = 0.0;
    local_fe8 = &local_12d8;
    local_fc0 = &local_12c8;
    local_fb0 = &local_1408;
    local_fb4 = local_12b8;
    local_500 = &local_fd8;
    local_504 = local_12b8;
    local_4e8 = local_12b8;
    local_4f8 = local_12b8;
    fStack_4f4 = local_12b8;
    fStack_4f0 = local_12b8;
    fStack_4ec = local_12b8;
    local_538 = CONCAT44(local_12b8,local_12b8);
    uStack_530 = CONCAT44(local_12b8,local_12b8);
    local_550 = &local_1408;
    local_558 = &local_fd8;
    uStack_540 = uStack_12c0;
    local_4d8 = local_12b8 * local_12c8;
    fStack_4d4 = local_12b8 * fStack_12c4;
    fStack_4d0 = local_12b8 * (float)uStack_12c0;
    fStack_4cc = local_12b8 * uStack_12c0._4_4_;
    local_4c0 = &local_1408;
    local_bb8 = CONCAT44(fStack_4d4,local_4d8);
    uStack_bb0 = CONCAT44(fStack_4cc,fStack_4d0);
    local_fe0 = &local_13f8;
    local_ff0 = &local_1408;
    local_ba8._0_4_ = (float)local_12d8;
    local_ba8._4_4_ = (float)((ulong)local_12d8 >> 0x20);
    uStack_ba0._0_4_ = (float)uStack_12d0;
    uStack_ba0._4_4_ = (float)(uStack_12d0 >> 0x20);
    local_478 = (float)local_ba8 + local_4d8;
    fStack_474 = local_ba8._4_4_ + fStack_4d4;
    fStack_470 = (float)uStack_ba0 + fStack_4d0;
    fStack_46c = uStack_ba0._4_4_ + fStack_4cc;
    local_460 = &local_13f8;
    local_b18 = CONCAT44(fStack_474,local_478);
    pVStack_b10 = (Vec3fa *)CONCAT44(fStack_46c,fStack_470);
    local_1060 = &local_13e8;
    local_1068 = &local_13f8;
    local_b00 = &local_13e8;
    local_f9c = (uint)local_1254;
    local_fa0 = (int)local_1258;
    local_f98 = &local_140c;
    local_fa4 = 0;
    local_20c = local_f9c | local_fa0 << 0x10;
    local_210 = 0;
    local_1c8 = 0xcc9e2d51;
    local_1cc = 0x1b873593;
    local_1d0 = 0xf;
    local_1d4 = 0xd;
    local_1d8 = 5;
    local_1dc = 0xe6546b64;
    uVar4 = local_20c * 0x16a88000 | local_20c * -0x3361d2af >> 0x11;
    local_1c4 = uVar4 * 0x1b873593;
    local_1c0 = (uVar4 * -0x194da000 | local_1c4 >> 0x13) * 5 + 0xe6546b64;
    local_1e8 = 0xcc9e2d51;
    local_1ec = 0x1b873593;
    local_1f0 = 0xf;
    local_1f4 = 0xd;
    local_1f8 = 5;
    local_1fc = 0xe6546b64;
    local_1e4 = 0;
    local_1e0 = (local_1c0 * 0x2000 | local_1c0 >> 0x13) * 5 + 0xe6546b64;
    uVar4 = (local_1e0 >> 0x10 ^ local_1e0) * -0x7a143595;
    local_214 = (uVar4 >> 0xd ^ uVar4) * -0x3d4d51cb;
    local_214 = local_214 >> 0x10 ^ local_214;
    local_1070 = &local_1368;
    local_1050 = local_1078;
    local_1020 = local_1078;
    local_1018 = &local_1368;
    local_1000 = &local_12c8;
    local_ff8 = local_1058;
    local_da0 = local_1010;
    local_d78 = local_d80;
    local_d68 = local_d80;
    local_d40 = local_d60;
    local_d28 = local_1024;
    local_d18 = local_d30;
    local_d10 = local_d70;
    local_d08 = local_d80;
    local_d00 = local_d38;
    local_ce8 = local_d38;
    local_ce0 = local_d30;
    local_cd8 = local_d80;
    local_cd0 = local_d70;
    local_cb0 = local_d70;
    fStack_ca4 = local_ca8;
    fStack_ca0 = local_ca8;
    fStack_c9c = local_ca8;
    local_c98 = local_d98;
    uStack_c90 = uStack_d90;
    local_c80 = local_d80;
    local_c78 = local_d70;
    local_c70 = local_d80;
    local_c68 = local_d60;
    local_c60 = local_d38;
    local_c58 = local_d80;
    local_c50 = local_d60;
    local_c30 = local_d60;
    fStack_c24 = local_c28;
    fStack_c20 = local_c28;
    fStack_c1c = local_c28;
    local_c18 = local_d98;
    uStack_c10 = uStack_d90;
    local_c00 = local_d80;
    local_bf8 = local_cc8;
    uStack_bf0 = uStack_cc0;
    local_be8 = local_d98;
    uStack_be0 = uStack_d90;
    local_bd8 = local_c48;
    uStack_bd0 = uStack_c40;
    local_ba8 = local_12d8;
    uStack_ba0 = uStack_12d0;
    fStack_b74 = local_ca8;
    fStack_b70 = local_c28;
    local_b60 = local_1010;
    local_b20 = local_1078;
    local_8ec = local_abc;
    local_8c8 = local_ad8;
    local_698 = uVar7;
    local_658 = local_b38;
    uStack_650 = uStack_b30;
    uStack_640 = local_1368._8_8_;
    local_618 = &local_12c8;
    local_610 = local_1058;
    local_5f0 = &local_12c8;
    local_5e8 = &local_12c8;
    local_5e0 = &local_12c8;
    local_5d8 = &local_12c8;
    local_598 = &local_12c8;
    local_590 = local_1058;
    local_560 = local_fc0;
    local_524 = local_61c;
    local_520 = local_5a0;
    local_518 = local_61c;
    fStack_514 = local_61c;
    fStack_510 = local_61c;
    fStack_50c = local_61c;
    local_508 = local_61c;
    local_4a0 = local_1058;
    local_480 = local_5d0;
    local_400 = local_5d0;
    local_3d8 = local_3e0;
    local_3c8 = local_3e0;
    local_3a0 = local_3c0;
    local_388 = local_abc;
    local_378 = local_390;
    local_370 = local_3d0;
    local_368 = local_3e0;
    local_360 = local_398;
    local_348 = local_398;
    local_340 = local_390;
    local_338 = local_3e0;
    local_330 = local_3d0;
    local_310 = local_3d0;
    local_308 = fStack_494;
    fStack_304 = fStack_494;
    fStack_300 = fStack_494;
    fStack_2fc = fStack_494;
    local_2f8 = local_3f8;
    uStack_2f0 = uStack_3f0;
    local_2e0 = local_3e0;
    local_2d8 = local_3d0;
    local_2d0 = local_3e0;
    local_2c8 = local_3c0;
    local_2c0 = local_398;
    local_2b8 = local_3e0;
    local_2b0 = local_3c0;
    local_290 = local_3c0;
    local_288 = fStack_490;
    fStack_284 = fStack_490;
    fStack_280 = fStack_490;
    fStack_27c = fStack_490;
    local_278 = local_3f8;
    uStack_270 = uStack_3f0;
    local_260 = local_3e0;
    local_258 = local_328;
    uStack_250 = uStack_320;
    local_248 = local_3f8;
    uStack_240 = uStack_3f0;
    local_238 = local_2a8;
    uStack_230 = uStack_2a0;
    local_208 = local_f98;
    local_1bc = local_214;
    local_140c = local_214;
    local_1408 = local_bb8;
    uStack_1400 = uStack_bb0;
    local_13f8 = local_b18;
    pVStack_13f0 = pVStack_b10;
    local_13e8 = local_b18;
    pVStack_13e0 = pVStack_b10;
    local_13c8 = local_b38;
    uStack_13c0 = uStack_b30;
    local_13b8 = local_b38;
    uStack_13b0 = uStack_b30;
    local_1088 = local_d98;
    uStack_1080 = uStack_d90;
    local_fd8 = local_538;
    uStack_fd0 = uStack_530;
    local_df8 = local_bc8;
    uStack_df0 = uStack_bc0;
    local_de8 = local_d58;
    uStack_de0 = uStack_d50;
    local_dd8 = local_c48;
    uStack_dd0 = uStack_c40;
    local_dc8 = local_cc8;
    uStack_dc0 = uStack_cc0;
    local_db8 = local_d98;
    uStack_db0 = uStack_d90;
    local_638 = local_588;
    uStack_630 = uStack_580;
    local_608 = local_3f8;
    uStack_600 = uStack_3f0;
    local_458 = local_228;
    uStack_450 = uStack_220;
    local_448 = local_3b8;
    uStack_440 = uStack_3b0;
    local_438 = local_2a8;
    uStack_430 = uStack_2a0;
    local_428 = local_328;
    uStack_420 = uStack_320;
    local_418 = local_3f8;
    uStack_410 = uStack_3f0;
    for (local_1410 = 0; local_1410 < 0x40; local_1410 = local_1410 + 1) {
      local_f80 = &local_1418;
      local_f88 = &local_140c;
      local_180 = local_140c;
      local_184 = 0x19660d;
      local_188 = 0x3c6ef35f;
      local_f8c = (float)(local_140c >> 1) * 4.656613e-10;
      local_174 = local_140c;
      local_178 = 0x19660d;
      local_17c = 0x3c6ef35f;
      local_140c = local_140c * 0x19660d + 0x3c6ef35f;
      local_f68 = &local_1418;
      local_f70 = &local_f8c;
      local_f78 = &local_f90;
      local_1414 = local_f90;
      local_f90 = (float)(local_140c >> 1) * 4.656613e-10;
      local_1b8 = local_f88;
      local_1b0 = local_f88;
      local_1a8 = local_f88;
      local_1a0 = local_f88;
      local_198 = local_f88;
      local_190 = local_f88;
      local_1418 = local_f8c;
      cosineSampleHemisphere
                (in_stack_ffffffffffffeb7c,in_stack_ffffffffffffeb78,in_stack_ffffffffffffeb70);
      local_1238 = &local_1498;
      local_e88 = &stack0xffffffffffffeb78;
      local_e68 = auStack_1468;
      local_f58 = &local_14a8;
      local_f60 = &local_13e8;
      local_14a8 = local_13e8;
      pVStackY_14a0 = pVStack_13e0;
      local_11f8 = &local_1498;
      local_1200 = &local_14a8;
      local_1498 = local_13e8;
      local_f50 = &local_1438;
      local_f48 = &local_14b8;
      local_14b8 = local_1438;
      uStackY_14b0 = uStack_1430;
      local_1208 = &stack0xffffffffffffeb78;
      local_1210 = &local_14b8;
      in_stack_ffffffffffffeb7c = (float)((ulong)local_1438 >> 0x20);
      in_stack_ffffffffffffeb78 = (float)local_1438;
      local_1100 = &local_1498;
      in_stack_ffffffffffffeb70 = pVStack_13e0;
      uVar10 = 0x3a83126f;
      local_10f0 = &inf;
      local_e80 = local_1238;
      fVar6 = std::numeric_limits<float>::infinity();
      local_1450 = 0xffffffff;
      local_1454 = 0xffffffff;
      local_10e0 = &local_1498;
      local_10d0 = &local_14d8;
      local_14d8 = 0;
      local_14d0 = 0;
      local_14c8 = 0;
      local_14c0 = 0;
      local_14d4 = local_126c;
      local_10c8 = &local_1498;
      rtcTraversableOccluded1(*(undefined8 *)(local_1250 + 8),local_10c8,&local_14d8);
      *local_1268 = *local_1268 + 1;
      if (0.0 <= fVar6) {
        local_13cc = local_13cc + 1.0;
      }
    }
    local_13cc = local_13cc * 0.015625;
    uVar7 = CONCAT44(fStack_13a4 * local_13cc,local_13a8 * local_13cc);
    *in_RDI = uVar7;
    in_RDI[1] = CONCAT44(fStack_139c * local_13cc,fStack_13a0 * local_13cc);
  }
  VVar9.field_0.m128[3] = fStack_13a4;
  VVar9.field_0.m128[2] = local_13a8;
  VVar9.field_0._0_8_ = uVar7;
  return (Vec3fa)VVar9.field_0;
}

Assistant:

Vec3fa renderPixelAOShader(const DebugShaderData& data, float x, float y, const ISPCCamera& camera, RayStats& stats, const RTCFeatureFlags feature_mask)
{
  /* initialize ray */
  Ray ray;
  ray.org = Vec3ff(camera.xfm.p);
  ray.dir = Vec3ff(normalize(x*camera.xfm.l.vx + y*camera.xfm.l.vy + camera.xfm.l.vz));
  ray.tnear() = 0.0f;
  ray.tfar = inf;
  ray.geomID = RTC_INVALID_GEOMETRY_ID;
  ray.primID = RTC_INVALID_GEOMETRY_ID;
  ray.mask = -1;
  ray.time() = data.debug;

  /* intersect ray with scene */
  RTCIntersectArguments args;
  rtcInitIntersectArguments(&args);
  args.feature_mask = feature_mask;
  rtcTraversableIntersect1(data.traversable,RTCRayHit_(ray),&args);
  RayStats_addRay(stats);

  /* shade pixel */
  if (ray.geomID == RTC_INVALID_GEOMETRY_ID) return Vec3fa(0.0f);

  Vec3fa Ng = normalize(ray.Ng);
  Vec3fa Nf = faceforward(Ng,ray.dir,Ng);
  Vec3fa col = Vec3fa(min(1.f,.3f+.8f*abs(dot(Ng,normalize(ray.dir)))));

  /* calculate hit point */
  float intensity = 0;
  Vec3fa hitPos = ray.org + ray.tfar * ray.dir;

#define AMBIENT_OCCLUSION_SAMPLES 64
  /* trace some ambient occlusion rays */
  RandomSampler sampler;
  RandomSampler_init(sampler, (int)x, (int)y, 0);
  for (int i=0; i<AMBIENT_OCCLUSION_SAMPLES; i++)
  {
    Vec2f sample = RandomSampler_get2D(sampler);
    Sample3f dir = cosineSampleHemisphere(sample.x,sample.y,Nf);

    /* initialize shadow ray */
    Ray shadow;
    shadow.org = Vec3ff(hitPos);
    shadow.dir = Vec3ff(dir.v);
    shadow.tnear() = 0.001f;
    shadow.tfar = inf;
    shadow.geomID = RTC_INVALID_GEOMETRY_ID;
    shadow.primID = RTC_INVALID_GEOMETRY_ID;
    shadow.mask = -1;
    shadow.time() = data.debug;

    /* trace shadow ray */
    RTCOccludedArguments args;
    rtcInitOccludedArguments(&args);
    args.feature_mask = feature_mask;
    rtcTraversableOccluded1(data.traversable,RTCRay_(shadow),&args);
    RayStats_addShadowRay(stats);

    /* add light contribution */
    if (shadow.tfar >= 0.0f)
      intensity += 1.0f;
  }
  intensity *= 1.0f/AMBIENT_OCCLUSION_SAMPLES;

  /* shade pixel */
  return col * intensity;
}